

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::SubTestContent
          (TextureAttachmentTest *this,GLenum attachment,GLenum texture_target,GLenum internalformat
          ,GLuint level,GLuint levels)

{
  deUint32 dVar1;
  RenderContext *pRVar2;
  GLfloat extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  float fVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_560;
  MessageBuilder local_550;
  int local_3cc;
  GetNameFunc p_Stack_3c8;
  GLint stencil;
  int local_3c0;
  Enum<int,_2UL> local_3b8;
  MessageBuilder local_3a8;
  float local_224;
  GetNameFunc p_Stack_220;
  GLfloat depth;
  int local_218;
  Enum<int,_2UL> local_210;
  GetNameFunc local_200;
  int local_1f8;
  Enum<int,_2UL> local_1f0 [2];
  MessageBuilder local_1d0;
  int local_4c;
  float local_48;
  int i;
  GLfloat color [4];
  Functions *gl;
  GLuint local_28;
  GLuint levels_local;
  GLuint level_local;
  GLenum internalformat_local;
  GLenum texture_target_local;
  GLenum attachment_local;
  TextureAttachmentTest *this_local;
  
  gl._4_4_ = levels;
  local_28 = level;
  levels_local = internalformat;
  level_local = texture_target;
  internalformat_local = attachment;
  _texture_target_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  color[2] = (GLfloat)(*pRVar2->_vptr_RenderContext[3])();
  color[3] = extraout_var;
  if (levels_local == 0x8058) {
    memset(&local_48,0,0x10);
    (**(code **)(color._8_8_ + 0x1220))(0,0,1,1,0x1908,0x1406,&local_48);
    dVar1 = (**(code **)(color._8_8_ + 0x800))();
    glu::checkError(dVar1,"glReadPixels has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x26f);
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      fVar6 = de::abs<float>((float)(&s_reference_color)[local_4c] - (&local_48)[local_4c]);
      if (0.0625 < fVar6) {
        pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar4 = tcu::TestContext::getLog(pTVar3);
        tcu::TestLog::operator<<(&local_1d0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1d0,
                            (char (*) [61])
                            "Named Framebuffer Texture Layer Attachment test failed with ");
        EVar7 = glu::getTextureTargetStr(level_local);
        local_200 = EVar7.m_getName;
        local_1f8 = EVar7.m_value;
        local_1f0[0].m_getName = local_200;
        local_1f0[0].m_value = local_1f8;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1f0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [20])0x2a6a75e);
        EVar7 = glu::getFramebufferAttachmentStr(internalformat_local);
        p_Stack_220 = EVar7.m_getName;
        local_218 = EVar7.m_value;
        local_210.m_getName = p_Stack_220;
        local_210.m_value = local_218;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_210);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [31])" attachment and texture level ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_28);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])" of texture with ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)&gl + 4));
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [52])
                                   " levels. The color content of the framebuffer was [");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_48);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&i);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,color);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,color + 1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"], but [");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&s_reference_color);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&DAT_02a6d904);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&DAT_02a6d908);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&DAT_02a6d90c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])0x2a70901);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d0);
        return false;
      }
    }
  }
  if ((levels_local == 0x81a6) || (levels_local == 0x88f0)) {
    local_224 = 0.0;
    (**(code **)(color._8_8_ + 0x1220))(0,0,1,1,0x1902,0x1406,&local_224);
    dVar1 = (**(code **)(color._8_8_ + 0x800))();
    glu::checkError(dVar1,"glReadPixels has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x289);
    fVar6 = de::abs<float>(0.5 - local_224);
    if (0.0625 < fVar6) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_3a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_3a8,
                          (char (*) [56])"Named Framebuffer Texture Layer Attachment test failed ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])"with texture set up as ");
      EVar7 = glu::getFramebufferAttachmentStr(internalformat_local);
      p_Stack_3c8 = EVar7.m_getName;
      local_3c0 = EVar7.m_value;
      local_3b8.m_getName = p_Stack_3c8;
      local_3b8.m_value = local_3c0;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3b8);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [31])" attachment and texture level ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_28);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])" of texture with ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)&gl + 4));
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [52])
                                 " levels. The depth content of the framebuffer was [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_224);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"], but [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)&s_reference_depth);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])0x2a70901);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a8);
      return false;
    }
  }
  if ((levels_local == 0x8d48) || (levels_local == 0x88f0)) {
    local_3cc = 0;
    (**(code **)(color._8_8_ + 0x1220))(0,0,1,1,0x1901,0x1404,&local_3cc);
    dVar1 = (**(code **)(color._8_8_ + 0x800))();
    glu::checkError(dVar1,"glReadPixels has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x29e);
    if (local_3cc != 7) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_550,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_550,
                          (char (*) [56])"Named Framebuffer Texture Layer Attachment test failed ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])"with texture set up as ");
      EVar7 = glu::getFramebufferAttachmentStr(internalformat_local);
      local_560.m_getName = EVar7.m_getName;
      local_560.m_value = EVar7.m_value;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_560);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [31])" attachment and texture level ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_28);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])" of texture with ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)&gl + 4));
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [54])
                                 " levels. The stencil content of the framebuffer was [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3cc);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [9])"], but [");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&s_reference_stencil);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])0x2a70901);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_550);
      return false;
    }
  }
  return true;
}

Assistant:

bool TextureAttachmentTest::SubTestContent(glw::GLenum attachment, glw::GLenum texture_target,
										   glw::GLenum internalformat, glw::GLuint level, glw::GLuint levels)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check framebuffer's color content. */
	if (GL_RGBA8 == internalformat)
	{
		glw::GLfloat color[4] = { 0.f };

		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, color);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		for (int i = 0; i < 4 /* color components */; ++i)
		{
			if (de::abs(s_reference_color[i] - color[i]) > 0.0625 /* precision */)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed with "
					<< glu::getTextureTargetStr(texture_target) << " texture set up as "
					<< glu::getFramebufferAttachmentStr(attachment) << " attachment and texture level " << level
					<< " of texture with " << levels << " levels. The color content of the framebuffer was ["
					<< color[0] << ", " << color[1] << ", " << color[2] << ", " << color[3] << "], but ["
					<< s_reference_color[0] << ", " << s_reference_color[1] << ", " << s_reference_color[2] << ", "
					<< s_reference_color[3] << "] was expected." << tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	/* Check framebuffer's depth content. */
	if ((GL_DEPTH_COMPONENT24 == internalformat) || (GL_DEPTH24_STENCIL8 == internalformat))
	{
		glw::GLfloat depth = 0.f;

		gl.readPixels(0, 0, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		if (de::abs(s_reference_depth - depth) > 0.0625 /* precision */)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed "
				<< "with texture set up as " << glu::getFramebufferAttachmentStr(attachment)
				<< " attachment and texture level " << level << " of texture with " << levels
				<< " levels. The depth content of the framebuffer was [" << depth << "], but [" << s_reference_depth
				<< "] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	/* Check framebuffer's stencil content. */
	if ((GL_STENCIL_INDEX8 == internalformat) || (GL_DEPTH24_STENCIL8 == internalformat))
	{
		glw::GLint stencil = 0;

		gl.readPixels(0, 0, 1, 1, GL_STENCIL_INDEX, GL_INT, &stencil);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

		if (s_reference_stencil != stencil)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Named Framebuffer Texture Layer Attachment test failed "
				<< "with texture set up as " << glu::getFramebufferAttachmentStr(attachment)
				<< " attachment and texture level " << level << " of texture with " << levels
				<< " levels. The stencil content of the framebuffer was [" << stencil << "], but ["
				<< s_reference_stencil << "] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}